

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O2

void __thiscall OpenMesh::ArrayKernel::request_face_status(ArrayKernel *this)

{
  uint uVar1;
  string local_40;
  allocator local_19;
  
  uVar1 = this->refcount_fstatus_;
  this->refcount_fstatus_ = uVar1 + 1;
  if (uVar1 == 0) {
    std::__cxx11::string::string((string *)&local_40,"f:status",&local_19);
    BaseKernel::add_property<OpenMesh::Attributes::StatusInfo>
              (&this->super_BaseKernel,&this->face_status_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void request_face_status()
  {
    if (!refcount_fstatus_++)
      add_property( face_status_, "f:status" );
  }